

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

NamedVertex * __thiscall
gss::innards::HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
          (NamedVertex *__return_storage_ptr__,HomomorphismModel *this,int v)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  ProofError *this_00;
  string local_38;
  
  if (-1 < v) {
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    lVar2 = *(long *)&((_Var1._M_head_impl)->pattern_vertex_proof_names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    if ((ulong)(uint)v <
        (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->pattern_vertex_proof_names + 8) -
                lVar2 >> 5)) {
      __return_storage_ptr__->first = v;
      lVar4 = (ulong)(uint)v * 0x20;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      lVar3 = *(long *)(lVar2 + lVar4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,lVar3,
                 *(long *)(lVar2 + 8 + lVar4) + lVar3);
      return __return_storage_ptr__;
    }
  }
  this_00 = (ProofError *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Oops, there\'s a bug: v out of range in pattern","");
  ProofError::ProofError(this_00,&local_38);
  __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
}

Assistant:

auto HomomorphismModel::pattern_vertex_for_proof(int v) const -> NamedVertex
{
    if (v < 0 || unsigned(v) >= _imp->pattern_vertex_proof_names.size())
        throw ProofError{"Oops, there's a bug: v out of range in pattern"};
    return pair{v, _imp->pattern_vertex_proof_names[v]};
}